

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O0

void __thiscall
CLI::detail::NonexistentPathValidator::NonexistentPathValidator(NonexistentPathValidator *this)

{
  anon_class_1_0_00000001 *in_stack_ffffffffffffffc8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffd0;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  Validator *in_stack_fffffffffffffff0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Validator::Validator(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

NonexistentPathValidator() : Validator("PATH(non-existing)") {
        func_ = [](std::string &filename) {
            auto path_result = check_path(filename.c_str());
            if(path_result != path_type::nonexistant) {
                return "Path already exists: " + filename;
            }
            return std::string();
        };
    }